

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImFontGlyph>::resize(ImVector<ImFontGlyph> *this,int new_size)

{
  int in_ESI;
  ImVector<ImFontGlyph> *in_RDI;
  ImVector<ImFontGlyph> *unaff_retaddr;
  ImVector<ImFontGlyph> *pIVar1;
  
  if (in_RDI->Capacity < in_ESI) {
    pIVar1 = in_RDI;
    _grow_capacity(in_RDI,in_ESI);
    reserve(unaff_retaddr,(int)((ulong)pIVar1 >> 0x20));
  }
  in_RDI->Size = in_ESI;
  return;
}

Assistant:

inline void         resize(int new_size)                { if (new_size > Capacity) reserve(_grow_capacity(new_size)); Size = new_size; }